

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

bool __thiscall Character::DelSpell(Character *this,short spell)

{
  int iVar1;
  const_iterator __first;
  undefined6 in_register_00000032;
  _List_node_base *p_Var2;
  list<Character_Spell,_std::allocator<Character_Spell>_> *__last;
  
  __last = &this->spells;
  __first._M_node = (_List_node_base *)__last;
  do {
    __first._M_node = (__first._M_node)->_M_next;
    if (__first._M_node == (_List_node_base *)__last) goto LAB_00111115;
    iVar1 = (int)CONCAT62(in_register_00000032,spell);
    p_Var2 = __first._M_node;
  } while (*(short *)&__first._M_node[1]._M_next != iVar1);
  while (p_Var2 = p_Var2->_M_next, p_Var2 != (_List_node_base *)__last) {
    if (*(short *)&p_Var2[1]._M_next != iVar1) {
      *(undefined1 *)((long)&__first._M_node[1]._M_next + 2) =
           *(undefined1 *)((long)&p_Var2[1]._M_next + 2);
      *(undefined2 *)&__first._M_node[1]._M_next = *(undefined2 *)&p_Var2[1]._M_next;
      __first._M_node = (__first._M_node)->_M_next;
    }
  }
LAB_00111115:
  std::__cxx11::list<Character_Spell,_std::allocator<Character_Spell>_>::erase
            (__last,__first,(const_iterator)__last);
  CheckQuestRules(this);
  return __first._M_node != (_List_node_base *)__last;
}

Assistant:

bool Character::DelSpell(short spell)
{
	auto remove_it = std::remove_if(UTIL_RANGE(this->spells), [&](Character_Spell cs) { return cs.id == spell; });
	bool removed = (remove_it != this->spells.end());
	this->spells.erase(remove_it, this->spells.end());

	this->CheckQuestRules();

	return removed;
}